

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O1

Ivy_Man_t * Ivy_ManFrames(Ivy_Man_t *pMan,int nLatches,int nFrames,int fInit,Vec_Ptr_t **pvMapping)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  Ivy_Man_t *p;
  Ivy_Obj_t *pIVar4;
  Vec_Ptr_t *pVVar5;
  void **__s;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  Ivy_Obj_t *p1;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong local_70;
  
  if (pMan->nObjs[4] != 0) {
    __assert_fail("Ivy_ManLatchNum(pMan) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyMan.c"
                  ,0xb2,"Ivy_Man_t *Ivy_ManFrames(Ivy_Man_t *, int, int, int, Vec_Ptr_t **)");
  }
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyMan.c"
                  ,0xb3,"Ivy_Man_t *Ivy_ManFrames(Ivy_Man_t *, int, int, int, Vec_Ptr_t **)");
  }
  iVar3 = pMan->nObjs[1];
  uVar18 = pMan->nObjs[2] - nLatches;
  iVar14 = pMan->vObjs->nSize;
  p = Ivy_ManStart();
  uVar16 = (ulong)uVar18;
  local_70 = (ulong)(uint)nLatches;
  uVar11 = local_70;
  uVar7 = uVar16;
  if (0 < nLatches) {
    do {
      if (fInit == 0) {
        pIVar4 = Ivy_ObjCreatePi(p);
      }
      else {
        pIVar4 = (Ivy_Obj_t *)((ulong)p->pConst1 ^ 1);
      }
      if (((int)uVar7 < 0) || (pMan->vPos->nSize <= (int)uVar7)) goto LAB_00757b7a;
      *(Ivy_Obj_t **)((long)pMan->vPos->pArray[uVar7] + 0x48) = pIVar4;
      uVar11 = uVar11 - 1;
      uVar7 = uVar7 + 1;
    } while (uVar11 != 0);
  }
  uVar2 = iVar3 - nLatches;
  iVar14 = iVar14 + -1;
  uVar19 = iVar14 * nFrames;
  iVar3 = uVar19 + 1;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < uVar19) {
    iVar8 = iVar3;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar8 << 3);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar3;
  lVar13 = 0;
  memset(__s,0,(long)iVar3 << 3);
  uVar11 = 1;
  if (1 < nFrames) {
    uVar11 = (ulong)(uint)nFrames;
  }
  uVar7 = 0;
  do {
    pMan->pConst1->pEquiv = p->pConst1;
    if (0 < (int)uVar2) {
      uVar12 = 0;
      do {
        pIVar4 = Ivy_ObjCreatePi(p);
        if ((long)pMan->vPis->nSize <= (long)uVar12) goto LAB_00757b7a;
        *(Ivy_Obj_t **)((long)pMan->vPis->pArray[uVar12] + 0x48) = pIVar4;
        uVar12 = uVar12 + 1;
      } while (uVar2 != uVar12);
    }
    if (0 < nLatches) {
      pVVar6 = pMan->vPos;
      uVar12 = local_70;
      uVar10 = uVar16;
      uVar17 = (ulong)uVar2;
      do {
        if (((((int)uVar10 < 0) || (pVVar6->nSize <= (int)uVar10)) || ((int)uVar17 < 0)) ||
           (pMan->vPis->nSize <= (int)uVar17)) goto LAB_00757b7a;
        *(undefined8 *)((long)pMan->vPis->pArray[uVar17] + 0x48) =
             *(undefined8 *)((long)pVVar6->pArray[uVar10] + 0x48);
        uVar17 = uVar17 + 1;
        uVar10 = uVar10 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    pVVar6 = pMan->vObjs;
    if (0 < pVVar6->nSize) {
      lVar15 = 0;
      do {
        pvVar1 = pVVar6->pArray[lVar15];
        if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 8) & 0xf) - 7)) {
          if (((ulong)pvVar1 & 1) != 0) goto LAB_00757b99;
          uVar12 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
          if (uVar12 == 0) {
            pIVar4 = (Ivy_Obj_t *)0x0;
          }
          else {
            pIVar4 = (Ivy_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar12 + 0x48)
                     );
          }
          uVar12 = *(ulong *)((long)pvVar1 + 0x18) & 0xfffffffffffffffe;
          if (uVar12 == 0) {
            p1 = (Ivy_Obj_t *)0x0;
          }
          else {
            p1 = (Ivy_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x18) & 1) ^ *(ulong *)(uVar12 + 0x48));
          }
          pIVar4 = Ivy_And(p,pIVar4,p1);
          *(Ivy_Obj_t **)((long)pvVar1 + 0x48) = pIVar4;
        }
        lVar15 = lVar15 + 1;
        pVVar6 = pMan->vObjs;
      } while (lVar15 < pVVar6->nSize);
    }
    if (0 < (int)uVar18) {
      uVar12 = 0;
      do {
        if ((long)pMan->vPos->nSize <= (long)uVar12) goto LAB_00757b7a;
        pvVar1 = pMan->vPos->pArray[uVar12];
        if (((ulong)pvVar1 & 1) != 0) goto LAB_00757b99;
        uVar10 = *(ulong *)((long)pvVar1 + 0x10);
        uVar17 = uVar10 & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          pIVar4 = (Ivy_Obj_t *)0x0;
        }
        else {
          pIVar4 = (Ivy_Obj_t *)((ulong)((uint)uVar10 & 1) ^ *(ulong *)(uVar17 + 0x48));
        }
        pIVar4 = Ivy_ObjCreatePo(p,pIVar4);
        if ((long)pMan->vPos->nSize <= (long)uVar12) goto LAB_00757b7a;
        *(Ivy_Obj_t **)((long)pMan->vPos->pArray[uVar12] + 0x48) = pIVar4;
        uVar12 = uVar12 + 1;
      } while (uVar16 != uVar12);
    }
    if (0 < nLatches) {
      pVVar6 = pMan->vPos;
      uVar12 = local_70;
      lVar15 = (long)(int)uVar18;
      do {
        if ((lVar15 < 0) || (pVVar6->nSize <= lVar15)) goto LAB_00757b7a;
        pvVar1 = pVVar6->pArray[lVar15];
        if (((ulong)pvVar1 & 1) != 0) {
LAB_00757b99:
          __assert_fail("!Ivy_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                        ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
        }
        uVar10 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = (ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar10 + 0x48);
        }
        *(ulong *)((long)pvVar1 + 0x48) = uVar10;
        lVar15 = lVar15 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    pVVar6 = pMan->vObjs;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      lVar15 = lVar13;
      do {
        if (pVVar6->pArray[lVar9] != (void *)0x0) {
          if ((lVar15 < 0) || (pVVar5->nSize <= lVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          pVVar5->pArray[lVar15] = *(void **)((long)pVVar6->pArray[lVar9] + 0x48);
        }
        lVar9 = lVar9 + 1;
        pVVar6 = pMan->vObjs;
        lVar15 = lVar15 + 1;
      } while (lVar9 < pVVar6->nSize);
    }
    uVar7 = uVar7 + 1;
    lVar13 = lVar13 + iVar14;
  } while (uVar7 != uVar11);
  if (0 < nLatches && fInit == 0) {
    do {
      if (((int)uVar16 < 0) || (pMan->vPos->nSize <= (int)uVar16)) {
LAB_00757b7a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ivy_ObjCreatePo(p,*(Ivy_Obj_t **)((long)pMan->vPos->pArray[uVar16] + 0x48));
      uVar16 = uVar16 + 1;
      local_70 = local_70 - 1;
    } while (local_70 != 0);
  }
  Ivy_ManCleanup(p);
  *pvMapping = pVVar5;
  iVar3 = Ivy_ManCheck(p);
  if (iVar3 == 0) {
    puts("Ivy_ManFrames(): The check has failed.");
  }
  return p;
}

Assistant:

Ivy_Man_t * Ivy_ManFrames( Ivy_Man_t * pMan, int nLatches, int nFrames, int fInit, Vec_Ptr_t ** pvMapping )
{
    Vec_Ptr_t * vMapping;
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i, f, nPis, nPos, nIdMax;
    assert( Ivy_ManLatchNum(pMan) == 0 );
    assert( nFrames > 0 );
    // prepare the mapping
    nPis = Ivy_ManPiNum(pMan) - nLatches;
    nPos = Ivy_ManPoNum(pMan) - nLatches;
    nIdMax = Ivy_ManObjIdMax(pMan);
    // create the new manager
    pNew = Ivy_ManStart();
    // set the starting values of latch inputs
    for ( i = 0; i < nLatches; i++ )
        Ivy_ManPo(pMan, nPos+i)->pEquiv = fInit? Ivy_Not(Ivy_ManConst1(pNew)) : Ivy_ObjCreatePi(pNew);
    // add timeframes
    vMapping = Vec_PtrStart( nIdMax * nFrames + 1 );
    for ( f = 0; f < nFrames; f++ )
    {
        // create PIs
        Ivy_ManConst1(pMan)->pEquiv = Ivy_ManConst1(pNew);
        for ( i = 0; i < nPis; i++ )
            Ivy_ManPi(pMan, i)->pEquiv = Ivy_ObjCreatePi(pNew);
        // transfer values to latch outputs
        for ( i = 0; i < nLatches; i++ )
            Ivy_ManPi(pMan, nPis+i)->pEquiv = Ivy_ManPo(pMan, nPos+i)->pEquiv;
        // perform strashing
        Ivy_ManForEachNode( pMan, pObj, i )
            pObj->pEquiv = Ivy_And( pNew, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
        // create POs
        for ( i = 0; i < nPos; i++ )
            Ivy_ManPo(pMan, i)->pEquiv = Ivy_ObjCreatePo( pNew, Ivy_ObjChild0Equiv(Ivy_ManPo(pMan, i)) );
        // set the results of latch inputs
        for ( i = 0; i < nLatches; i++ )
            Ivy_ManPo(pMan, nPos+i)->pEquiv = Ivy_ObjChild0Equiv(Ivy_ManPo(pMan, nPos+i));
        // save the pointers in this frame
        Ivy_ManForEachObj( pMan, pObj, i )
            Vec_PtrWriteEntry( vMapping, f * nIdMax + i, pObj->pEquiv );
    }
    // connect latches
    if ( !fInit )
        for ( i = 0; i < nLatches; i++ )
            Ivy_ObjCreatePo( pNew, Ivy_ManPo(pMan, nPos+i)->pEquiv );
    // remove dangling nodes
    Ivy_ManCleanup(pNew);
    *pvMapping = vMapping;
    // check the resulting network
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManFrames(): The check has failed.\n" );
    return pNew;
}